

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void applyNumericAffinity(Mem *pRec,int bTryForInt)

{
  u8 enc_00;
  int iVar1;
  MemValue MStack_28;
  u8 enc;
  i64 iValue;
  double rValue;
  Mem *pMStack_10;
  int bTryForInt_local;
  Mem *pRec_local;
  
  enc_00 = pRec->enc;
  rValue._4_4_ = bTryForInt;
  pMStack_10 = pRec;
  iVar1 = sqlite3AtoF(pRec->z,(double *)&iValue,pRec->n,enc_00);
  if (iVar1 != 0) {
    iVar1 = sqlite3Atoi64(pMStack_10->z,(i64 *)&stack0xffffffffffffffd8,pMStack_10->n,enc_00);
    if (iVar1 == 0) {
      pMStack_10->u = MStack_28;
      pMStack_10->flags = pMStack_10->flags | 4;
    }
    else {
      (pMStack_10->u).i = iValue;
      pMStack_10->flags = pMStack_10->flags | 8;
      if (rValue._4_4_ != 0) {
        sqlite3VdbeIntegerAffinity(pMStack_10);
      }
    }
    pMStack_10->flags = pMStack_10->flags & 0xfffd;
  }
  return;
}

Assistant:

static void applyNumericAffinity(Mem *pRec, int bTryForInt){
  double rValue;
  i64 iValue;
  u8 enc = pRec->enc;
  assert( (pRec->flags & (MEM_Str|MEM_Int|MEM_Real))==MEM_Str );
  if( sqlite3AtoF(pRec->z, &rValue, pRec->n, enc)==0 ) return;
  if( 0==sqlite3Atoi64(pRec->z, &iValue, pRec->n, enc) ){
    pRec->u.i = iValue;
    pRec->flags |= MEM_Int;
  }else{
    pRec->u.r = rValue;
    pRec->flags |= MEM_Real;
    if( bTryForInt ) sqlite3VdbeIntegerAffinity(pRec);
  }
  /* TEXT->NUMERIC is many->one.  Hence, it is important to invalidate the
  ** string representation after computing a numeric equivalent, because the
  ** string representation might not be the canonical representation for the
  ** numeric value.  Ticket [343634942dd54ab57b7024] 2018-01-31. */
  pRec->flags &= ~MEM_Str;
}